

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O3

int Abc_NodeMffcLabel(Abc_Obj_t *pNode)

{
  ulong uVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  int iVar4;
  int *__s;
  int iVar5;
  
  iVar3 = Abc_NodeDeref_rec(pNode);
  pAVar2 = pNode->pNtk;
  if ((pAVar2->vTravIds).pArray == (int *)0x0) {
    iVar4 = pAVar2->vObjs->nSize;
    uVar1 = (long)iVar4 + 500;
    iVar5 = (int)uVar1;
    if ((pAVar2->vTravIds).nCap < iVar5) {
      __s = (int *)malloc(uVar1 * 4);
      (pAVar2->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar2->vTravIds).nCap = iVar5;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar4) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
    }
    (pAVar2->vTravIds).nSize = iVar5;
  }
  iVar4 = pAVar2->nTravIds;
  pAVar2->nTravIds = iVar4 + 1;
  if (iVar4 < 0x3fffffff) {
    Abc_NodeMffcLabel_rec(pNode,1);
    iVar4 = Abc_NodeRef_rec(pNode);
    if (iVar3 == iVar4) {
      return iVar3;
    }
    __assert_fail("Count1 == Count2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcRefs.c"
                  ,0x1bf,"int Abc_NodeMffcLabel(Abc_Obj_t *)");
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NodeMffcLabel( Abc_Obj_t * pNode )
{
    int Count1, Count2;
    // dereference the node
    Count1 = Abc_NodeDeref_rec( pNode );
    // collect the nodes inside the MFFC
    Abc_NtkIncrementTravId( pNode->pNtk );
    Abc_NodeMffcLabel_rec( pNode, 1 );
    // reference it back
    Count2 = Abc_NodeRef_rec( pNode );
    assert( Count1 == Count2 );
    return Count1;
}